

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O0

void __thiscall
Js::SourceTextModuleRecord::SetNamespace
          (SourceTextModuleRecord *this,ModuleNamespace *moduleNamespace)

{
  WriteBarrierPtr<void> *pWVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  WriteBarrierPtr<void> **ppWVar5;
  undefined4 *puVar6;
  ModuleNamespace *moduleNamespace_local;
  SourceTextModuleRecord *this_local;
  
  ppWVar5 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                      ((WriteBarrierPtr *)&this->localExportSlots);
  if (*ppWVar5 == (WriteBarrierPtr<void> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                ,0x1c7,"(localExportSlots != nullptr)","localExportSlots != nullptr"
                               );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  ModuleRecordBase::SetNamespace(&this->super_ModuleRecordBase,moduleNamespace);
  ppWVar5 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                      ((WriteBarrierPtr *)&this->localExportSlots);
  pWVar1 = *ppWVar5;
  uVar4 = GetLocalExportSlotCount(this);
  Memory::WriteBarrierPtr<void>::operator=(pWVar1 + uVar4,moduleNamespace);
  return;
}

Assistant:

void SourceTextModuleRecord::SetNamespace(ModuleNamespace* moduleNamespace)
    {
        Assert(localExportSlots != nullptr);
        __super::SetNamespace(moduleNamespace);
        localExportSlots[GetLocalExportSlotCount()] = moduleNamespace;
    }